

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_blockwise.hpp
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
utility::detail::
generate_block_bounds<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,detail *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *generator,
          size_t block_size,size_t range_length,int64_t min,int64_t max)

{
  initializer_list<long> __l;
  ulong uVar1;
  ulong uVar2;
  result_type_conflict1 __x;
  longlong local_e8;
  longlong local_e0;
  longlong kth_stat;
  urd_order_statistic_distribution<double> osd;
  unsigned_long k;
  unsigned_long i;
  size_t block_count;
  size_t remainder;
  allocator<long> local_71;
  size_t local_70;
  size_t *local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<long,_std::allocator<long>_> bounds;
  size_t n;
  int64_t max_local;
  int64_t min_local;
  size_t range_length_local;
  size_t block_size_local;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *generator_local;
  
  local_68 = &local_70;
  local_60 = 1;
  local_70 = range_length;
  bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)block_size;
  n = min;
  max_local = range_length;
  min_local = block_size;
  range_length_local = (size_t)generator;
  block_size_local = (size_t)this;
  generator_local =
       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
       __return_storage_ptr__;
  std::allocator<long>::allocator(&local_71);
  __l._M_len = local_60;
  __l._M_array = (iterator)local_68;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_58,__l,&local_71);
  std::allocator<long>::~allocator(&local_71);
  uVar2 = (ulong)min_local % range_length_local;
  uVar1 = (ulong)min_local / range_length_local;
  for (k = 0; k < (uVar1 + (uVar2 != 0)) - 1; k = k + 1) {
    osd.m_uniform._M_param._M_b = (double)((k + 1) * range_length_local);
    urd_order_statistic_distribution<double>::urd_order_statistic_distribution
              ((urd_order_statistic_distribution<double> *)&kth_stat,
               (size_t)bounds.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(size_t)osd.m_uniform._M_param._M_b
               ,(double)max_local,(double)(long)n);
    __x = urd_order_statistic_distribution<double>::operator()
                    ((urd_order_statistic_distribution<double> *)&kth_stat,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     block_size_local);
    local_e8 = llround(__x);
    local_e0 = local_e8;
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)local_58,&local_e8);
  }
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)local_58,(value_type_conflict1 *)&n);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,(vector<long,_std::allocator<long>_> *)local_58);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

auto
            generate_block_bounds
            (
                URNG && generator,
                std::size_t block_size,
                std::size_t range_length,
                std::int64_t min,
                std::int64_t max
            )
        {
            const auto n = range_length;
            auto bounds = std::vector<std::int64_t>{min};

            const auto remainder = range_length % block_size;
            const auto block_count =
                range_length / block_size + static_cast<std::size_t>(remainder != 0);
            for (auto i = 0ul; i < block_count - 1; ++i)
            {
                const auto k = (i + 1) * block_size;

                auto osd =
                    utility::urd_order_statistic_distribution<double>
                    (
                        n,
                        k,
                        static_cast<double>(min),
                        static_cast<double>(max)
                    );
                const auto kth_stat = std::llround(osd(generator));

                bounds.push_back(kth_stat);
            }
            bounds.push_back(max);

            return bounds;
        }